

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

int soplex::
    SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (IdxElement *keys,IdxCompare *compare,int start,int end,int size,int start2,int end2,
              bool type)

{
  type_conflict5 tVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  int start_00;
  undefined4 in_register_00000014;
  uint uVar3;
  int iVar4;
  int iVar5;
  int size_00;
  undefined4 in_register_00000084;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  IdxElement *pIVar9;
  IdxElement *pIVar10;
  int local_40c;
  IdxElement *local_408;
  IdxCompare *local_400;
  undefined8 local_3f8;
  long local_3f0;
  long local_3e8;
  ulong local_3e0;
  int local_3d4;
  IdxElement *local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  ulong local_3b8;
  IdxElement pivotkey;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_374;
  IdxElement tmp;
  IdxElement local_300;
  IdxElement local_2c4;
  IdxElement local_288;
  IdxElement local_24c;
  IdxElement local_210;
  IdxElement local_1d4;
  IdxElement local_198;
  IdxElement local_15c;
  IdxElement local_120;
  IdxElement local_e4;
  IdxElement local_a8;
  IdxElement local_6c;
  
  local_3f8 = CONCAT44(in_register_00000084,size);
  local_3c0 = CONCAT44(in_register_00000014,start);
  local_3c8 = CONCAT44(in_register_0000000c,end);
  if (end <= start) {
    return 0;
  }
  if (start + 1 == end) {
    return 1;
  }
  uVar8 = (ulong)(uint)start2;
  if (start2 <= start) {
    uVar8 = (ulong)(uint)start;
  }
  iVar2 = (int)uVar8;
  local_3d4 = iVar2 + size;
  uVar3 = end - 1;
  local_400 = compare;
  if ((int)uVar3 <= local_3d4) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,end,compare,iVar2,type);
    return uVar3;
  }
  pivotkey.val.m_backend.fpclass = cpp_dec_float_finite;
  pivotkey.val.m_backend.prec_elem = 10;
  pivotkey.val.m_backend.data._M_elems[0] = 0;
  pivotkey.val.m_backend.data._M_elems[1] = 0;
  pivotkey.val.m_backend.data._M_elems[2] = 0;
  pivotkey.val.m_backend.data._M_elems[3] = 0;
  pivotkey.val.m_backend.data._M_elems[4] = 0;
  pivotkey.val.m_backend.data._M_elems[5] = 0;
  pivotkey.val.m_backend.data._M_elems._24_5_ = 0;
  pivotkey.val.m_backend.data._M_elems[7]._1_3_ = 0;
  pivotkey.val.m_backend.data._M_elems._32_5_ = 0;
  pivotkey.val.m_backend._37_8_ = 0;
  tmp.val.m_backend.fpclass = cpp_dec_float_finite;
  tmp.val.m_backend.prec_elem = 10;
  tmp.val.m_backend.data._M_elems[0] = 0;
  tmp.val.m_backend.data._M_elems[1] = 0;
  tmp.val.m_backend.data._M_elems[2] = 0;
  tmp.val.m_backend.data._M_elems[3] = 0;
  tmp.val.m_backend.data._M_elems[4] = 0;
  tmp.val.m_backend.data._M_elems[5] = 0;
  tmp.val.m_backend.data._M_elems._24_5_ = 0;
  tmp.val.m_backend.data._M_elems[7]._1_3_ = 0;
  tmp.val.m_backend.data._M_elems._32_5_ = 0;
  tmp.val.m_backend._37_8_ = 0;
  local_3d0 = keys + (int)(iVar2 + uVar3) / 2;
  local_408 = keys;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::IdxElement::operator=(&pivotkey,local_3d0);
  local_3e8 = (long)(int)uVar3;
  local_3f0 = (long)iVar2;
  local_3e0 = uVar8;
  local_3b8 = (ulong)uVar3;
  do {
    uVar8 = (ulong)(int)uVar8;
    if (type) {
      pIVar10 = local_408 + uVar8;
      for (; (long)uVar8 < local_3e8; uVar8 = uVar8 + 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_6c,pIVar10);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_a8,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_374,local_400,&local_6c,&local_a8);
        local_40c = 0;
        tVar1 = boost::multiprecision::operator<(&local_374,&local_40c);
        if (!tVar1) break;
        pIVar10 = pIVar10 + 1;
      }
      lVar6 = (long)(int)uVar3;
      pIVar10 = local_408 + lVar6;
      for (; local_3f0 < lVar6; lVar6 = lVar6 + -1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_e4,pIVar10);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_120,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_374,local_400,&local_e4,&local_120);
        local_40c = 0;
        tVar1 = boost::multiprecision::operator>=(&local_374,&local_40c);
        if (!tVar1) break;
        pIVar10 = pIVar10 + -1;
      }
    }
    else {
      lVar6 = (long)(int)uVar3;
      pIVar10 = local_408 + uVar8;
      for (; (long)uVar8 < local_3e8; uVar8 = uVar8 + 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_15c,pIVar10);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_198,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_374,local_400,&local_15c,&local_198);
        local_40c = 0;
        tVar1 = boost::multiprecision::operator<=(&local_374,&local_40c);
        if (!tVar1) break;
        pIVar10 = pIVar10 + 1;
      }
      pIVar10 = local_408 + lVar6;
      for (; local_3f0 < lVar6; lVar6 = lVar6 + -1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_1d4,pIVar10);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_210,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_374,local_400,&local_1d4,&local_210);
        local_40c = 0;
        tVar1 = boost::multiprecision::operator>(&local_374,&local_40c);
        if (!tVar1) break;
        pIVar10 = pIVar10 + -1;
      }
    }
    pIVar10 = local_408;
    iVar4 = (int)uVar8;
    iVar2 = (int)lVar6;
    if (iVar2 <= iVar4) break;
    pIVar9 = local_408 + iVar4;
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(&tmp,pIVar9);
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(pIVar9,pIVar10 + iVar2);
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(pIVar10 + iVar2,&tmp);
    uVar8 = (ulong)(iVar4 + 1);
    uVar3 = iVar2 - 1;
  } while( true );
  if (type) {
    uVar8 = (ulong)iVar4;
    pIVar10 = local_408 + uVar8;
    for (; (long)uVar8 < local_3e8; uVar8 = uVar8 + 1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_24c,&pivotkey);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_288,pIVar10);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxCompare::operator()(&local_374,local_400,&local_24c,&local_288);
      local_40c = 0;
      tVar1 = boost::multiprecision::operator>=(&local_374,&local_40c);
      if (!tVar1) break;
      pIVar10 = pIVar10 + 1;
    }
    iVar4 = (int)local_3e0;
    if (iVar4 == (int)uVar8) {
      pIVar9 = local_408 + local_3f0;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(&tmp,pIVar9);
      pIVar10 = local_3d0;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar9,local_3d0);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar10,&tmp);
      uVar8 = (ulong)(iVar4 + 1);
    }
  }
  else {
    uVar7 = (ulong)iVar2;
    pIVar10 = local_408 + uVar7;
    for (; local_3f0 < (long)uVar7; uVar7 = uVar7 - 1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_2c4,&pivotkey);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_300,pIVar10);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxCompare::operator()(&local_374,local_400,&local_2c4,&local_300);
      local_40c = 0;
      tVar1 = boost::multiprecision::operator<=(&local_374,&local_40c);
      if (!tVar1) break;
      pIVar10 = pIVar10 + -1;
    }
    if ((int)local_3b8 == (int)uVar7) {
      pIVar9 = local_408 + local_3e8;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(&tmp,pIVar9);
      pIVar10 = local_3d0;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar9,local_3d0);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar10,&tmp);
      uVar7 = (ulong)((int)local_3c8 - 2);
    }
    iVar2 = (int)uVar7;
    iVar4 = (int)local_3e0;
  }
  pIVar10 = local_408;
  size_00 = (int)local_3f8;
  if (iVar2 - iVar4 < size_00 * 2) {
    iVar5 = (int)uVar8;
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (local_408,iVar2 + 1,local_400,iVar4,!type);
    if (size_00 <= iVar5 - iVar4) {
      return iVar5 + -1;
    }
    size_00 = local_3d4 - iVar5;
    start_00 = (int)local_3c0;
    iVar2 = (int)local_3c8;
    iVar4 = iVar5;
  }
  else {
    iVar2 = iVar2 + 1;
    start_00 = (int)local_3c0;
  }
  iVar2 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    (pIVar10,local_400,start_00,iVar2,size_00,iVar4,end2,!type);
  return iVar2;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}